

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxAbs::Resolve(FxAbs *this,FCompileContext *ctx)

{
  PType *pPVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  FxConstant *this_00;
  undefined4 uVar5;
  FScriptPosition *other;
  FxExpression *v;
  ExpVal value;
  anon_union_8_3_addc324a_for_ExpVal_1 local_40;
  ExpVal local_38;
  FxExpression *pFVar4;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->val == (FxExpression *)0x0) {
LAB_0052bd9f:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  iVar3 = (*this->val->_vptr_FxExpression[2])();
  pFVar4 = (FxExpression *)CONCAT44(extraout_var,iVar3);
  this->val = pFVar4;
  if (pFVar4 == (FxExpression *)0x0) goto LAB_0052bd9f;
  if (pFVar4->ValueType == (PType *)TypeBool) {
    this->val = (FxExpression *)0x0;
LAB_0052bdd1:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return pFVar4;
  }
  cVar2 = (**(code **)(*(long *)&pFVar4->ValueType->super_PTypeBase + 0x40))();
  if (cVar2 == '\0') {
    pFVar4 = (FxExpression *)0x0;
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
    goto LAB_0052bdd1;
  }
  iVar3 = (*this->val->_vptr_FxExpression[3])();
  if ((char)iVar3 == '\0') {
    (this->super_FxExpression).ValueType = this->val->ValueType;
    return &this->super_FxExpression;
  }
  pPVar1 = (PType *)this->val[1]._vptr_FxExpression;
  other = &this->val[1].ScriptPosition;
  if (pPVar1 == (PType *)TypeString) {
    FString::AttachToOther((FString *)&local_40,&other->FileName);
  }
  else {
    local_40 = (anon_union_8_3_addc324a_for_ExpVal_1)(other->FileName).Chars;
  }
  if (pPVar1->RegType == '\x01') {
    local_40.Float = local_40.Float & 0x7fffffffffffffff;
  }
  else {
    if (pPVar1->RegType != '\0') {
      this_00 = (FxConstant *)0x0;
      goto LAB_0052bea0;
    }
    uVar5 = -local_40.Int;
    if (0 < local_40.Int) {
      uVar5 = local_40.Int;
    }
    local_40.Int = uVar5;
  }
  this_00 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
  local_38.Type = pPVar1;
  if (pPVar1 == (PType *)TypeString) {
    FString::AttachToOther((FString *)&local_38.field_1,(FString *)&local_40);
  }
  else {
    local_38.field_1 = local_40;
  }
  FxConstant::FxConstant(this_00,&local_38,&(this->super_FxExpression).ScriptPosition);
  if (local_38.Type == (PType *)TypeString) {
    FString::~FString((FString *)&local_38.field_1);
  }
LAB_0052bea0:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  if (pPVar1 != (PType *)TypeString) {
    return &this_00->super_FxExpression;
  }
  FString::~FString((FString *)&local_40);
  return &this_00->super_FxExpression;
}

Assistant:

FxExpression *FxAbs::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(val, ctx);

	if (val->ValueType == TypeBool)	// abs of a boolean is always the same as the operand
	{
		auto v = val;
		val = nullptr;
		delete this;
		return v;
	}
	if (!val->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return nullptr;
	}
	else if (val->isConstant())
	{
		ExpVal value = static_cast<FxConstant *>(val)->GetValue();
		switch (value.Type->GetRegType())
		{
		case REGT_INT:
			value.Int = abs(value.Int);
			break;

		case REGT_FLOAT:
			value.Float = fabs(value.Float);
			break;

		default:
			// shouldn't happen
			delete this;
			return nullptr;
		}
		FxExpression *x = new FxConstant(value, ScriptPosition);
		delete this;
		return x;
	}
	ValueType = val->ValueType;
	return this;
}